

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_pragma.cpp
# Opt level: O2

unique_ptr<duckdb::BoundPragmaInfo,_std::default_delete<duckdb::BoundPragmaInfo>,_true> __thiscall
duckdb::Binder::BindPragma(Binder *this,PragmaInfo *info,QueryErrorContext error_context)

{
  ClientContext *pCVar1;
  Binder *binder_p;
  type pEVar2;
  PragmaFunctionCatalogEntry *pPVar3;
  idx_t offset;
  QueryErrorContext in_RCX;
  optional_ptr<duckdb::LogicalType,_true> result_type;
  long *plVar4;
  allocator local_301;
  Binder *local_300;
  optional_idx local_2f8;
  optional_idx bound_idx;
  FunctionBinder function_binder;
  vector<duckdb::Value,_true> params;
  QueryErrorContext error_context_local;
  string local_2a8;
  ErrorData error;
  named_parameter_map_t named_parameters;
  PragmaFunction bound_function;
  ConstantBinder pragma_binder;
  
  params.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
  super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  params.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
  super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  params.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
  super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  named_parameters._M_h._M_buckets = &named_parameters._M_h._M_single_bucket;
  named_parameters._M_h._M_bucket_count = 1;
  named_parameters._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  named_parameters._M_h._M_element_count = 0;
  named_parameters._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  named_parameters._M_h._M_rehash_policy._M_next_resize = 0;
  named_parameters._M_h._M_single_bucket = (__node_base_ptr)0x0;
  pCVar1 = (ClientContext *)(info->name)._M_dataplus._M_p;
  ::std::__cxx11::string::string((string *)&local_2a8,"PRAGMA value",(allocator *)&bound_function);
  ConstantBinder::ConstantBinder(&pragma_binder,(Binder *)info,pCVar1,&local_2a8);
  ::std::__cxx11::string::~string((string *)&local_2a8);
  local_300 = *(Binder **)((long)error_context.query_location.index + 0x38);
  local_2f8 = error_context.query_location.index;
  for (result_type.ptr = *(LogicalType **)((long)error_context.query_location.index + 0x30);
      (Binder *)result_type.ptr != local_300;
      result_type.ptr = (LogicalType *)&(result_type.ptr)->type_info_) {
    ExpressionBinder::Bind
              ((ExpressionBinder *)&error,
               (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                *)&pragma_binder,result_type,false);
    pCVar1 = (ClientContext *)(info->name)._M_dataplus._M_p;
    pEVar2 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator*((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                        *)&error);
    ExpressionExecutor::EvaluateScalar((Value *)&bound_function,pCVar1,pEVar2,true);
    ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::emplace_back<duckdb::Value>
              ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&params,
               (Value *)&bound_function);
    Value::~Value((Value *)&bound_function);
    if (error._0_8_ != 0) {
      (**(code **)(*(long *)error._0_8_ + 8))();
    }
  }
  plVar4 = (long *)(local_2f8.index + 0x58);
  local_300 = (Binder *)info;
  while (binder_p = local_300, plVar4 = (long *)*plVar4, plVar4 != (long *)0x0) {
    ExpressionBinder::Bind
              ((ExpressionBinder *)&function_binder,
               (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                *)&pragma_binder,(LogicalType *)(plVar4 + 5),false);
    pCVar1 = local_300->context;
    pEVar2 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator*((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                        *)&function_binder);
    ExpressionExecutor::EvaluateScalar((Value *)&error,pCVar1,pEVar2,true);
    ::std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>
    ::pair<duckdb::Value,_true>
              ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>
                *)&bound_function,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(plVar4 + 1),
               (Value *)&error);
    ::std::
    _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,duckdb::Value>,std::allocator<std::pair<std::__cxx11::string_const,duckdb::Value>>,std::__detail::_Select1st,duckdb::CaseInsensitiveStringEquality,duckdb::CaseInsensitiveStringHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
    ::_M_emplace<std::pair<std::__cxx11::string,duckdb::Value>>
              ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,duckdb::Value>,std::allocator<std::pair<std::__cxx11::string_const,duckdb::Value>>,std::__detail::_Select1st,duckdb::CaseInsensitiveStringEquality,duckdb::CaseInsensitiveStringHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                *)&named_parameters,&bound_function);
    ::std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>
    ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>
             *)&bound_function);
    Value::~Value((Value *)&error);
    if (function_binder.binder.ptr != (Binder *)0x0) {
      (*(code *)((__weak_count<(__gnu_cxx::_Lock_policy)2> *)
                ((long)&((((function_binder.binder.ptr)->
                          super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
                          super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                        super_enable_shared_from_this<duckdb::Binder>).__weak_this_ + 8))->_M_pi)();
    }
  }
  pCVar1 = local_300->context;
  ::std::__cxx11::string::string
            ((string *)&bound_function,anon_var_dwarf_3b2a81b + 9,(allocator *)&function_binder);
  ::std::__cxx11::string::string((string *)&error,"main",(allocator *)&bound_idx);
  pPVar3 = Catalog::GetEntry<duckdb::PragmaFunctionCatalogEntry>
                     (pCVar1,(string *)&bound_function,(string *)&error,
                      (string *)(local_2f8.index + 0x10),(QueryErrorContext)0xffffffffffffffff);
  ::std::__cxx11::string::~string((string *)&error);
  ::std::__cxx11::string::~string((string *)&bound_function);
  FunctionBinder::FunctionBinder(&function_binder,binder_p);
  ErrorData::ErrorData(&error);
  bound_idx = FunctionBinder::BindFunction
                        (&function_binder,
                         &(pPVar3->super_FunctionEntry).super_StandardEntry.super_InCatalogEntry.
                          super_CatalogEntry.name,&pPVar3->functions,&params,&error);
  if (bound_idx.index == 0xffffffffffffffff) {
    ErrorData::AddQueryLocation(&error,in_RCX);
    ::std::__cxx11::string::string((string *)&bound_function,anon_var_dwarf_3b2a81b + 9,&local_301);
    ErrorData::Throw(&error,(string *)&bound_function);
  }
  offset = optional_idx::GetIndex(&bound_idx);
  FunctionSet<duckdb::PragmaFunction>::GetFunctionByOffset
            (&bound_function,&(pPVar3->functions).super_FunctionSet<duckdb::PragmaFunction>,offset);
  BindNamedParameters(&bound_function.named_parameters,&named_parameters,&error_context_local,
                      &bound_function.super_SimpleNamedParameterFunction.super_SimpleFunction.
                       super_Function.name);
  make_uniq<duckdb::BoundPragmaInfo,duckdb::PragmaFunction,duckdb::vector<duckdb::Value,true>,std::unordered_map<std::__cxx11::string,duckdb::Value,duckdb::CaseInsensitiveStringHashFunction,duckdb::CaseInsensitiveStringEquality,std::allocator<std::pair<std::__cxx11::string_const,duckdb::Value>>>>
            ((duckdb *)this,&bound_function,&params,&named_parameters);
  PragmaFunction::~PragmaFunction(&bound_function);
  ErrorData::~ErrorData(&error);
  ConstantBinder::~ConstantBinder(&pragma_binder);
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&named_parameters._M_h);
  ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
            ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&params);
  return (unique_ptr<duckdb::BoundPragmaInfo,_std::default_delete<duckdb::BoundPragmaInfo>_>)
         (unique_ptr<duckdb::BoundPragmaInfo,_std::default_delete<duckdb::BoundPragmaInfo>_>)this;
}

Assistant:

unique_ptr<BoundPragmaInfo> Binder::BindPragma(PragmaInfo &info, QueryErrorContext error_context) {
	vector<Value> params;
	named_parameter_map_t named_parameters;

	// resolve the parameters
	ConstantBinder pragma_binder(*this, context, "PRAGMA value");
	for (auto &param : info.parameters) {
		auto bound_value = pragma_binder.Bind(param);
		auto value = ExpressionExecutor::EvaluateScalar(context, *bound_value, true);
		params.push_back(std::move(value));
	}

	for (auto &entry : info.named_parameters) {
		auto bound_value = pragma_binder.Bind(entry.second);
		auto value = ExpressionExecutor::EvaluateScalar(context, *bound_value, true);
		named_parameters.insert(make_pair(entry.first, std::move(value)));
	}

	// bind the pragma function
	auto &entry = Catalog::GetEntry<PragmaFunctionCatalogEntry>(context, INVALID_CATALOG, DEFAULT_SCHEMA, info.name);
	FunctionBinder function_binder(*this);
	ErrorData error;
	auto bound_idx = function_binder.BindFunction(entry.name, entry.functions, params, error);
	if (!bound_idx.IsValid()) {
		D_ASSERT(error.HasError());
		error.AddQueryLocation(error_context);
		error.Throw();
	}
	auto bound_function = entry.functions.GetFunctionByOffset(bound_idx.GetIndex());
	// bind and check named params
	BindNamedParameters(bound_function.named_parameters, named_parameters, error_context, bound_function.name);
	return make_uniq<BoundPragmaInfo>(std::move(bound_function), std::move(params), std::move(named_parameters));
}